

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

stumpless_target * stumpless_set_transport_port(stumpless_target *target,char *port)

{
  network_target *target_00;
  char *__ptr;
  char *pcVar1;
  
  if (target == (stumpless_target *)0x0) {
    pcVar1 = "target was NULL";
  }
  else {
    if (port != (char *)0x0) {
      pcVar1 = copy_cstring(port);
      if (pcVar1 == (char *)0x0) {
        return (stumpless_target *)0x0;
      }
      lock_target(target);
      if (target->type != STUMPLESS_NETWORK_TARGET) {
        raise_target_incompatible("transport ports are only valid for network targets");
        unlock_target(target);
        free_mem(pcVar1);
        return (stumpless_target *)0x0;
      }
      target_00 = (network_target *)target->id;
      __ptr = target_00->port;
      target_00->port = pcVar1;
      clear_error();
      reopen_network_target(target_00);
      unlock_target(target);
      free_mem(__ptr);
      return target;
    }
    pcVar1 = "port was NULL";
  }
  raise_argument_empty(pcVar1);
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_set_transport_port( struct stumpless_target *target,
                              const char *port ) {
  const char *port_copy;
  struct network_target *net_target;
  const char *old_port;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( port );

  port_copy = copy_cstring( port );
  if( !port_copy ) {
    return NULL;
  }

  lock_target( target );
  if( target->type != STUMPLESS_NETWORK_TARGET ) {
    raise_target_incompatible( L10N_TRANSPORT_PORT_NETWORK_ONLY_ERROR_MESSAGE );
    goto cleanup_and_fail;
  }

  net_target = target->id;
  old_port = net_target->port;
  net_target->port = port_copy;
  clear_error(  );

  reopen_network_target( net_target );

  unlock_target( target );
  free_mem( old_port );
  return target;

cleanup_and_fail:
  unlock_target( target );
  free_mem( port_copy );
  return NULL;
}